

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::RecomputeBufferLimits(CodedInputStream *this)

{
  int *piVar1;
  int closest_limit;
  CodedInputStream *this_local;
  
  this->buffer_end_ = this->buffer_end_ + this->buffer_size_after_limit_;
  piVar1 = std::min<int>(&this->current_limit_,&this->total_bytes_limit_);
  if (*piVar1 < this->total_bytes_read_) {
    this->buffer_size_after_limit_ = this->total_bytes_read_ - *piVar1;
    this->buffer_end_ = this->buffer_end_ + -(long)this->buffer_size_after_limit_;
  }
  else {
    this->buffer_size_after_limit_ = 0;
  }
  return;
}

Assistant:

inline void CodedInputStream::RecomputeBufferLimits() {
  buffer_end_ += buffer_size_after_limit_;
  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  if (closest_limit < total_bytes_read_) {
    // The limit position is in the current buffer.  We must adjust
    // the buffer size accordingly.
    buffer_size_after_limit_ = total_bytes_read_ - closest_limit;
    buffer_end_ -= buffer_size_after_limit_;
  } else {
    buffer_size_after_limit_ = 0;
  }
}